

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O0

void Abc_TruthNpnPrint(char *pCanonPermInit,uint uCanonPhase,int nVars)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  char local_30;
  int local_2c;
  char acStack_28 [4];
  int i;
  char pCanonPerm [16];
  int nVars_local;
  uint uCanonPhase_local;
  char *pCanonPermInit_local;
  
  pCanonPerm._8_4_ = nVars;
  pCanonPerm._12_4_ = uCanonPhase;
  if (nVars < 0x11) {
    for (local_2c = 0; local_2c < (int)pCanonPerm._8_4_; local_2c = local_2c + 1) {
      if (pCanonPermInit == (char *)0x0) {
        local_30 = (char)local_2c + 'a';
      }
      else {
        local_30 = pCanonPermInit[local_2c];
      }
      acStack_28[local_2c] = local_30;
    }
    iVar2 = Abc_InfoHasBit((uint *)(pCanonPerm + 0xc),pCanonPerm._8_4_);
    uVar4 = 0x7a;
    if (iVar2 != 0) {
      uVar4 = 0x5a;
    }
    printf("   %c = ( ",uVar4);
    for (local_2c = 0; local_2c < (int)pCanonPerm._8_4_; local_2c = local_2c + 1) {
      cVar1 = acStack_28[local_2c];
      iVar2 = Abc_InfoHasBit((uint *)(pCanonPerm + 0xc),acStack_28[local_2c] + -0x61);
      pcVar3 = ",";
      if (local_2c == pCanonPerm._8_4_ + -1) {
        pcVar3 = "";
      }
      printf("%c%s",(ulong)(uint)((int)cVar1 + iVar2 * -0x20),pcVar3);
    }
    printf(" )  ");
    return;
  }
  __assert_fail("nVars <= 16",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpn.c"
                ,0x9d,"void Abc_TruthNpnPrint(char *, unsigned int, int)");
}

Assistant:

void Abc_TruthNpnPrint( char * pCanonPermInit, unsigned uCanonPhase, int nVars )
{
    char pCanonPerm[16]; int i;
    assert( nVars <= 16 );
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = pCanonPermInit ? pCanonPermInit[i] : 'a' + i;
    printf( "   %c = ( ", Abc_InfoHasBit(&uCanonPhase, nVars) ? 'Z':'z' );
    for ( i = 0; i < nVars; i++ )
        printf( "%c%s", pCanonPerm[i] + ('A'-'a') * Abc_InfoHasBit(&uCanonPhase, pCanonPerm[i]-'a'), i == nVars-1 ? "":"," );
    printf( " )  " );
}